

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::from_integer<int,jsoncons::string_sink<std::__cxx11::wstring>>
          (int value,
          string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *result)

{
  assertion_error *this;
  uint uVar1;
  int iVar2;
  ulong uVar4;
  type_conflict2 tVar5;
  ulong uVar6;
  value_type *pvVar7;
  allocator<char> local_449;
  string local_448;
  char_type buf [255];
  ulong uVar3;
  
  if (value < 0) {
    uVar4 = (ulong)(uint)value;
    uVar3 = 0;
    do {
      iVar2 = (int)uVar4;
      *(int *)((long)buf + uVar3) = 0x30 - iVar2 % 10;
      uVar6 = uVar3 + 4;
      if (0x3f7 < uVar3) break;
      uVar4 = (long)iVar2 / 10 & 0xffffffff;
      uVar3 = uVar6;
    } while (iVar2 - 10U < 0xffffffed);
  }
  else {
    uVar3 = (ulong)(uint)value;
    uVar4 = 0;
    do {
      uVar1 = (uint)uVar3;
      *(uint *)((long)buf + uVar4) = (uint)(uVar3 % 10) | 0x30;
      uVar6 = uVar4 + 4;
      if (0x3f7 < uVar4) break;
      uVar3 = uVar3 / 10;
      uVar4 = uVar6;
    } while (9 < uVar1);
  }
  if (uVar6 == 0x3fc) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"assertion \'p != last\' failed at  <> :0",&local_449);
    assertion_error::assertion_error(this,&local_448);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar5 = uVar6 >> 2;
  if (value < 0) {
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,0x2d);
    tVar5 = tVar5 + 1;
  }
  pvVar7 = (value_type *)(uVar6 + (long)buf);
  while (pvVar7 = pvVar7 + -1, buf <= pvVar7) {
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back(result,*pvVar7);
  }
  return tVar5;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }